

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap_test.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::coap::MockEndpoint::Send
          (Error *__return_storage_ptr__,MockEndpoint *this,ByteArray *aBuf,MessageSubType aSubType)

{
  if (this->mDropMessage == false) {
    std::
    deque<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
    ::emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>const&>
              ((deque<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                *)&this->mSendQueue,aBuf);
    event_active(&this->mPeer->mSendEvent,0,0);
  }
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

Error Send(const ByteArray &aBuf, MessageSubType aSubType) override
    {
        (void)aSubType;

        if (!mDropMessage)
        {
            mSendQueue.emplace(aBuf);
            event_active(&mPeer->mSendEvent, 0, 0);
        }
        return ERROR_NONE;
    }